

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O1

void __thiscall
Wave::Wave(Wave *this,uint height,uint width,
          vector<double,_std::allocator<double>_> *patterns_frequencies)

{
  iterator __position;
  bool bVar1;
  uint uVar2;
  pointer pdVar3;
  long lVar4;
  ulong uVar5;
  size_t width_00;
  ulong uVar6;
  vector<double,_std::allocator<double>_> *plogp;
  uint uVar7;
  double dVar8;
  double dVar9;
  double base_s;
  double base_entropy;
  double entropy_base;
  double log_base_s;
  value_type_conflict2 local_80;
  allocator_type local_79;
  value_type local_78;
  vector<double,_std::allocator<double>_> local_70;
  value_type local_58;
  uint local_4c;
  double local_48;
  double local_40;
  double local_38;
  
  local_4c = height;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->patterns_frequencies,patterns_frequencies);
  (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar3 = (patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      local_48 = pdVar3[uVar5];
      dVar8 = log(local_48);
      local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(dVar8 * local_48);
      __position._M_current =
           (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->plogp_patterns_frequencies,__position,(double *)&local_70);
      }
      else {
        *__position._M_current =
             (double)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pdVar3 = (patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = uVar6 < (ulong)((long)(patterns_frequencies->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar3 >> 3);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
  }
  uVar2 = local_4c;
  pdVar3 = (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->plogp_patterns_frequencies).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pdVar3;
  if (lVar4 == 0) {
    dVar8 = INFINITY;
  }
  else {
    uVar5 = 0;
    dVar9 = INFINITY;
    do {
      dVar8 = ABS(pdVar3[uVar5] * 0.5);
      if (dVar9 <= dVar8) {
        dVar8 = dVar9;
      }
      uVar5 = uVar5 + 1;
      dVar9 = dVar8;
    } while ((uVar5 & 0xffffffff) < (ulong)(lVar4 >> 3));
  }
  this->min_abs_half_plogp = dVar8;
  (this->memoisation).plogp_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memoisation).plogp_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memoisation).plogp_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memoisation).sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memoisation).sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memoisation).sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memoisation).log_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memoisation).log_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memoisation).log_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memoisation).nb_patterns.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memoisation).nb_patterns.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memoisation).nb_patterns.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  width_00 = (long)(patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
  this->nb_patterns = width_00;
  uVar7 = width * local_4c;
  uVar5 = (ulong)uVar7;
  Array2D<unsigned_char>::Array2D(&this->data,uVar5,width_00,'\x01');
  this->width = width;
  this->height = uVar2;
  this->size = uVar7;
  local_58 = 0.0;
  local_78 = 0.0;
  if (this->nb_patterns != 0) {
    local_78 = 0.0;
    local_58 = 0.0;
    uVar6 = 0;
    do {
      local_58 = local_58 +
                 (this->plogp_patterns_frequencies).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar6];
      local_78 = local_78 +
                 (patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                 .super__Vector_impl_data._M_start[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) < this->nb_patterns);
  }
  local_38 = log(local_78);
  local_40 = local_38 - local_58 / local_78;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_70,uVar5,&local_58,(allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->memoisation).plogp_sum,&local_70);
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_70,uVar5,&local_78,(allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->memoisation).sum,&local_70);
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_70,uVar5,&local_38,(allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->memoisation).log_sum,&local_70);
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_80 = (value_type_conflict2)this->nb_patterns;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,uVar5,&local_80,
             &local_79);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&(this->memoisation).nb_patterns,&local_70);
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_70,uVar5,&local_40,(allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->memoisation).entropy,&local_70);
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Wave::Wave(unsigned height, unsigned width,
     const std::vector<double> &patterns_frequencies) noexcept
  : patterns_frequencies(patterns_frequencies),
    plogp_patterns_frequencies(get_plogp(patterns_frequencies)),
    min_abs_half_plogp(get_min_abs_half(plogp_patterns_frequencies)),
    is_impossible(false), nb_patterns(patterns_frequencies.size()),
    data(width * height, nb_patterns, 1), width(width), height(height),
    size(height * width) {
  // Initialize the memoisation of entropy.
  double base_entropy = 0;
  double base_s = 0;
  for (unsigned i = 0; i < nb_patterns; i++) {
    base_entropy += plogp_patterns_frequencies[i];
    base_s += patterns_frequencies[i];
  }
  double log_base_s = log(base_s);
  double entropy_base = log_base_s - base_entropy / base_s;
  memoisation.plogp_sum = std::vector<double>(width * height, base_entropy);
  memoisation.sum = std::vector<double>(width * height, base_s);
  memoisation.log_sum = std::vector<double>(width * height, log_base_s);
  memoisation.nb_patterns =
    std::vector<unsigned>(width * height, static_cast<unsigned>(nb_patterns));
  memoisation.entropy = std::vector<double>(width * height, entropy_base);
}